

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubdirectoryDisposer.cpp
# Opt level: O0

void __thiscall
ApprovalTests::SubdirectoryDisposer::~SubdirectoryDisposer(SubdirectoryDisposer *this)

{
  string *this_00;
  string *in_RDI;
  
  this_00 = (string *)ApprovalTestNamer::testConfiguration();
  ::std::__cxx11::string::operator=(this_00,in_RDI);
  ::std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

SubdirectoryDisposer::~SubdirectoryDisposer()
    {
        ApprovalTestNamer::testConfiguration().subdirectory = previous_result;
    }